

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Frame * pbrt::Frame::FromY(Frame *__return_storage_ptr__,Normal3f y)

{
  undefined1 auVar1 [64];
  Tuple3<pbrt::Vector3,_float> local_50;
  Tuple3<pbrt::Vector3,_float> local_40;
  Tuple3<pbrt::Normal3,_float> local_30;
  
  local_30.z = y.super_Tuple3<pbrt::Normal3,_float>.z;
  auVar1._8_56_ = y._8_56_;
  auVar1._0_8_ = y.super_Tuple3<pbrt::Normal3,_float>._0_8_;
  local_40.x = 0.0;
  local_40.y = 0.0;
  local_50.x = 0.0;
  local_50.y = 0.0;
  local_40.z = 0.0;
  local_50.z = 0.0;
  local_30._0_8_ = vmovlps_avx(auVar1._0_16_);
  CoordinateSystem<float>
            ((Normal3<float> *)&local_30,(Vector3<float> *)&local_50,(Vector3<float> *)&local_40);
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.x = local_40.x;
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.y = local_40.y;
  (__return_storage_ptr__->x).super_Tuple3<pbrt::Vector3,_float>.z = local_40.z;
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.x = local_30.x;
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.y = local_30.y;
  (__return_storage_ptr__->y).super_Tuple3<pbrt::Vector3,_float>.z = local_30.z;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.x = local_50.x;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.y = local_50.y;
  (__return_storage_ptr__->z).super_Tuple3<pbrt::Vector3,_float>.z = local_50.z;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    static Frame FromY(Normal3f y) {
        Vector3f x, z;
        CoordinateSystem(y, &z, &x);
        return Frame(x, Vector3f(y), z);
    }